

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboTestCase.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::FboTestCase::checkSampleCount
          (FboTestCase *this,deUint32 sizedFormat,int numSamples)

{
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  allocator<char> local_89;
  string local_88;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_68 [3];
  int *local_50;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  undefined1 local_38 [8];
  vector<int,_std::allocator<int>_> supportedSampleCounts;
  int local_18;
  int minSampleCount;
  int numSamples_local;
  deUint32 sizedFormat_local;
  FboTestCase *this_local;
  
  local_18 = numSamples;
  minSampleCount = sizedFormat;
  _numSamples_local = this;
  supportedSampleCounts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = getMinimumSampleCount(sizedFormat);
  if (supportedSampleCounts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < local_18) {
    pRVar3 = Context::getRenderContext((this->super_TestCase).m_context);
    iVar2 = (*pRVar3->_vptr_RenderContext[3])();
    querySampleCounts((vector<int,_std::allocator<int>_> *)local_38,
                      (Functions *)CONCAT44(extraout_var,iVar2),minSampleCount);
    local_48._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)local_38);
    local_50 = (int *)std::vector<int,_std::allocator<int>_>::end
                                ((vector<int,_std::allocator<int>_> *)local_38);
    local_40 = std::
               find<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int>
                         (local_48,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                    )local_50,&local_18);
    local_68[0]._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)local_38);
    bVar1 = __gnu_cxx::operator==(&local_40,local_68);
    if (bVar1) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"Sample count not supported",&local_89);
      tcu::NotSupportedError::NotSupportedError(this_00,&local_88);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_38);
  }
  return;
}

Assistant:

void FboTestCase::checkSampleCount (deUint32 sizedFormat, int numSamples)
{
	const int minSampleCount = getMinimumSampleCount(sizedFormat);

	if (numSamples > minSampleCount)
	{
		// Exceeds spec-mandated minimum - need to check.
		const std::vector<int> supportedSampleCounts = querySampleCounts(m_context.getRenderContext().getFunctions(), sizedFormat);

		if (std::find(supportedSampleCounts.begin(), supportedSampleCounts.end(), numSamples) == supportedSampleCounts.end())
			throw tcu::NotSupportedError("Sample count not supported");
	}
}